

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_tmx_file(char *filename,Image *input_image,vector<Tile_*,_std::allocator<Tile_*>_> *tiles
                   ,vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,TileSize tileSize)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *output_image_filename;
  ostream *poVar5;
  size_type sVar6;
  int local_288;
  uint id_1;
  int x;
  int i_1;
  int y;
  uint id;
  int i;
  int total_tiles;
  ofstream out;
  int tilemap_height;
  int tilemap_width;
  allocator local_51;
  string local_50 [8];
  string tileset_filename;
  TileSize tileSize_local;
  vector<Tile_*,_std::allocator<Tile_*>_> *tilemap_local;
  vector<Tile_*,_std::allocator<Tile_*>_> *tiles_local;
  Image *input_image_local;
  char *filename_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,filename,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=(local_50,".png");
  output_image_filename = (char *)std::__cxx11::string::c_str();
  write_tiles_to_png_image(output_image_filename,input_image,tiles);
  uVar1 = input_image->width >> 3;
  uVar2 = input_image->height >> 3;
  std::ofstream::ofstream(&i);
  std::ofstream::open((char *)&i,(_Ios_Openmode)filename);
  std::operator<<((ostream *)&i,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  std::operator<<((ostream *)&i,
                  "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\""
                 );
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&i,uVar1);
  poVar5 = std::operator<<(poVar5,"\" height=\"");
  std::ostream::operator<<(poVar5,uVar2);
  poVar5 = std::operator<<((ostream *)&i,"\" tilewidth=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
  poVar5 = std::operator<<(poVar5,"\" tileheight=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
  std::operator<<(poVar5,"\">\n");
  poVar5 = std::operator<<((ostream *)&i," <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
  poVar5 = std::operator<<(poVar5,"\" tileheight=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
  std::operator<<(poVar5,"\">\n");
  poVar5 = std::operator<<((ostream *)&i,"  <image source=\"");
  poVar5 = std::operator<<(poVar5,local_50);
  std::operator<<(poVar5,"\" />\n");
  std::operator<<((ostream *)&i," </tileset>\n");
  poVar5 = std::operator<<((ostream *)&i," <layer name=\"Bottom\" width=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
  poVar5 = std::operator<<(poVar5,"\" height=\"");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  std::operator<<(poVar5,"\">\n");
  std::operator<<((ostream *)&i,"  <data encoding=\"csv\" >");
  sVar6 = std::vector<Tile_*,_std::allocator<Tile_*>_>::size(tilemap);
  iVar3 = (int)sVar6;
  if (tileSize == TILE_8x8) {
    for (y = 0; y < iVar3; y = y + 1) {
      uVar2 = get_tmx_tile_id(tilemap,y);
      std::ostream::operator<<((ostream *)&i,uVar2);
      if (y < iVar3 + -1) {
        std::operator<<((ostream *)&i,",");
      }
      if (y % (int)uVar1 == uVar1 - 1) {
        std::operator<<((ostream *)&i,"\n");
      }
    }
  }
  else if (tileSize == TILE_8x16) {
    for (x = 0; x < (int)uVar2; x = x + 1) {
      id_1 = (x / 2) * uVar1 * 2 + x % 2;
      for (local_288 = 0; local_288 < (int)uVar1; local_288 = local_288 + 1) {
        uVar4 = get_tmx_tile_id(tilemap,id_1);
        std::ostream::operator<<((ostream *)&i,uVar4);
        if ((int)id_1 < iVar3 + -1) {
          std::operator<<((ostream *)&i,",");
        }
        if (local_288 % (int)uVar1 == uVar1 - 1) {
          std::operator<<((ostream *)&i,"\n");
        }
        id_1 = id_1 + 2;
      }
    }
  }
  std::operator<<((ostream *)&i,"  </data>\n");
  std::operator<<((ostream *)&i," </layer>\n");
  std::operator<<((ostream *)&i,"</map>\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&i);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void write_tmx_file(const char *filename, Image *input_image, std::vector<Tile *> *tiles, std::vector<Tile *> *tilemap,
                    TileSize tileSize) {
    std::string tileset_filename = filename;

    tileset_filename += ".png";

    write_tiles_to_png_image(tileset_filename.c_str(), input_image, tiles);

    int tilemap_width = input_image->width / TILE_WIDTH;
    int tilemap_height = input_image->height / TILE_HEIGHT;

    std::ofstream out;
    out.open(filename);

    out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    out << "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\"";
    out << tilemap_width << "\" height=\"" << tilemap_height;
    out << "\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_HEIGHT << "\">\n";
    out << " <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_WIDTH <<
    "\">\n";
    out << "  <image source=\"" << tileset_filename << "\" />\n";
    out << " </tileset>\n";


    out << " <layer name=\"Bottom\" width=\"" << tilemap_width << "\" height=\"" << tilemap_height << "\">\n";
    out << "  <data encoding=\"csv\" >";

    int total_tiles = tilemap->size();

    if (tileSize == TILE_8x8) {
        for (int i = 0; i < total_tiles; i++) {
            unsigned int id = get_tmx_tile_id(tilemap, i);

            out << id;

            if (i < total_tiles - 1) {
                out << ",";
            }

            if (i % tilemap_width == tilemap_width - 1) {
                out << "\n";
            }
        }
    } else if (tileSize == TILE_8x16) {
        for (int y = 0; y < tilemap_height; y++) {
            int i = (y / 2) * tilemap_width * 2 + (y % 2);
            for (int x = 0; x < tilemap_width; x++, i += 2) {
                unsigned int id = get_tmx_tile_id(tilemap, i);

                out << id;

                if (i < total_tiles - 1) {
                    out << ",";
                }

                if (x % tilemap_width == tilemap_width - 1) {
                    out << "\n";
                }
            }
        }
    }

    out << "  </data>\n";
    out << " </layer>\n";
    out << "</map>\n";

    out.close();
}